

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O2

void __thiscall
tcu::ThreadUtil::CompareData::CompareData
          (CompareData *this,SharedPtr<tcu::ThreadUtil::DataBlock> *a,
          SharedPtr<tcu::ThreadUtil::DataBlock> *b)

{
  SharedPtr<tcu::ThreadUtil::Object> local_48;
  SharedPtr<tcu::ThreadUtil::Object> local_38;
  
  Operation::Operation(&this->super_Operation,"CompareData");
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__CompareData_003e1da8;
  de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr(&this->m_a,a);
  de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr(&this->m_b,b);
  local_38.m_ptr = &a->m_ptr->super_Object;
  local_38.m_state = a->m_state;
  if (local_38.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_38.m_state)->strongRefCount = (local_38.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_38.m_state)->weakRefCount = (local_38.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::readObject(&this->super_Operation,&local_38);
  de::SharedPtr<tcu::ThreadUtil::Object>::release(&local_38);
  local_48.m_ptr = &b->m_ptr->super_Object;
  local_48.m_state = b->m_state;
  if (local_48.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_48.m_state)->strongRefCount = (local_48.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_48.m_state)->weakRefCount = (local_48.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::readObject(&this->super_Operation,&local_48);
  de::SharedPtr<tcu::ThreadUtil::Object>::release(&local_48);
  return;
}

Assistant:

CompareData::CompareData (SharedPtr<DataBlock> a, SharedPtr<DataBlock> b)
	: Operation	("CompareData")
	, m_a		(a)
	, m_b		(b)
{
	readObject(SharedPtr<Object>(a));
	readObject(SharedPtr<Object>(b));
}